

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall ac::core::Image::Image(Image *this)

{
  this->w = 0;
  this->h = 0;
  this->c = 0;
  this->elementType = 1;
  this->pitch = 0;
  this->pixels = (void *)0x0;
  (this->dptr).super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->dptr).super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

ac::core::Image::Image(const int w, const int h, const int c, const ElementType elementType, void* const data, const int stride) :
    w(w), h(h), c(c), elementType(elementType),
    pitch(stride > 0 ? stride : w * c * (elementType & 0xff)),
    pixels(nullptr), dptr(nullptr)
{
    int size = this->h * this->pitch;
    if (!(size > 0)) return;
    if (data) this->pixels = data;
    else
    {
        this->dptr = std::make_shared<ImageData>(size);
        this->pixels = this->dptr->data;
    }
}